

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<int,_QList<int>_>_>::reallocate
          (QMovableArrayOps<std::pair<int,_QList<int>_>_> *this,qsizetype alloc,
          AllocationOption option)

{
  pair<QTypedArrayData<std::pair<int,_QList<int>_>_>_*,_std::pair<int,_QList<int>_>_*> pVar1;
  
  pVar1 = QTypedArrayData<std::pair<int,_QList<int>_>_>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<std::pair<int,_QList<int>_>_>).
                     super_QArrayDataPointer<std::pair<int,_QList<int>_>_>.d,
                     (this->super_QGenericArrayOps<std::pair<int,_QList<int>_>_>).
                     super_QArrayDataPointer<std::pair<int,_QList<int>_>_>.ptr,alloc,option);
  if (pVar1.second != (pair<int,_QList<int>_> *)0x0) {
    (this->super_QGenericArrayOps<std::pair<int,_QList<int>_>_>).
    super_QArrayDataPointer<std::pair<int,_QList<int>_>_>.d = pVar1.first;
    (this->super_QGenericArrayOps<std::pair<int,_QList<int>_>_>).
    super_QArrayDataPointer<std::pair<int,_QList<int>_>_>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }